

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_MON_HEAL_HP(effect_handler_context_t *context)

{
  byte *pbVar1;
  _Bool _Var2;
  wchar_t wVar3;
  monster *mon;
  char *pcVar4;
  short sVar5;
  char *fmt;
  char m_name [80];
  char m_poss [80];
  
  if ((context->origin).what == SRC_MONSTER) {
    wVar3 = (context->origin).which.monster;
    if (wVar3 < L'\x01') {
      mon = (monster *)0x0;
    }
    else {
      mon = cave_monster(cave,wVar3);
    }
    wVar3 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
    if (mon != (monster *)0x0) {
      monster_desc(m_name,0x50,mon,L'̔');
      monster_desc(m_poss,0x50,mon,L'\"');
      if (player->timed[2] == 0) {
        _Var2 = monster_is_visible(mon);
      }
      else {
        _Var2 = false;
      }
      sVar5 = (short)wVar3 + mon->hp;
      mon->hp = sVar5;
      if (sVar5 < mon->maxhp) {
        pcVar4 = "%s looks healthier.";
        fmt = "%s sounds healthier.";
      }
      else {
        mon->hp = mon->maxhp;
        pcVar4 = "%s looks REALLY healthy!";
        fmt = "%s sounds REALLY healthy!";
      }
      if (_Var2 != false) {
        fmt = pcVar4;
      }
      msg(fmt,m_name);
      if (player->upkeep->health_who == mon) {
        pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      if (mon->m_timed[3] != 0) {
        mon_clear_timed(mon,L'\x03',L'\x04');
        msg("%s recovers %s courage.",m_name,m_poss);
      }
      context->ident = true;
    }
    return true;
  }
  __assert_fail("context->origin.what == SRC_MONSTER",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-attack.c"
                ,0x100,"_Bool effect_handler_MON_HEAL_HP(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_MON_HEAL_HP(effect_handler_context_t *context)
{
	assert(context->origin.what == SRC_MONSTER);

	int midx = context->origin.which.monster;
	struct monster *mon = midx > 0 ? cave_monster(cave, midx) : NULL;

	int amount = effect_calculate_value(context, false);
	char m_name[80], m_poss[80];
	bool seen;

	if (!mon) return true;

	/* Get the monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

	/* Get the monster possessive ("his"/"her"/"its") */
	monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

	seen = (!player->timed[TMD_BLIND] && monster_is_visible(mon));

	/* Heal some */
	mon->hp += amount;

	/* Fully healed */
	if (mon->hp >= mon->maxhp) {
		mon->hp = mon->maxhp;

		if (seen)
			msg("%s looks REALLY healthy!", m_name);
		else
			msg("%s sounds REALLY healthy!", m_name);
	} else if (seen) { /* Partially healed */
		msg("%s looks healthier.", m_name);
	} else {
		msg("%s sounds healthier.", m_name);
	}

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Cancel fear */
	if (mon->m_timed[MON_TMD_FEAR]) {
		mon_clear_timed(mon, MON_TMD_FEAR, MON_TMD_FLG_NOMESSAGE);
		msg("%s recovers %s courage.", m_name, m_poss);
	}

	/* ID */
	context->ident = true;

	return true;
}